

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

ListNode * list_remove(ListNode *node,CleanupListValue cleanup_value,void *cleanup_value_data)

{
  undefined8 in_RDX;
  code *in_RSI;
  ListNode *in_RDI;
  
  _assert_true((unsigned_long)cleanup_value_data,(char *)in_RDI,(char *)in_RSI,
               (int)((ulong)in_RDX >> 0x20));
  in_RDI->prev->next = in_RDI->next;
  in_RDI->next->prev = in_RDI->prev;
  if (in_RSI != (code *)0x0) {
    (*in_RSI)(in_RDI->value,in_RDX);
  }
  return in_RDI;
}

Assistant:

static ListNode* list_remove(
        ListNode * const node, const CleanupListValue cleanup_value,
        void * const cleanup_value_data) {
    assert_non_null(node);
    node->prev->next = node->next;
    node->next->prev = node->prev;
    if (cleanup_value) {
        cleanup_value(node->value, cleanup_value_data);
    }
    return node;
}